

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O2

Boxed_Value
chaiscript::dispatch::detail::
Handle_Return<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>::
handle<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,void>
          (pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value> *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  make_shared<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
            ((pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value> *)&stack0xffffffffffffffe0);
  Boxed_Value::Object_Data::get<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
            ((Object_Data *)r,
             (shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_> *)
             &stack0xffffffffffffffe0,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)r;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }